

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int balloc(bstring b,int len)

{
  int iVar1;
  int iVar2;
  uchar *__ptr;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uchar *__dest;
  
  if (b == (bstring)0x0) {
    return -1;
  }
  __ptr = b->data;
  if (__ptr == (uchar *)0x0) {
    return -1;
  }
  iVar1 = b->slen;
  if ((long)iVar1 < 0) {
    return -1;
  }
  iVar2 = b->mlen;
  if (iVar2 < 1) {
    return -1;
  }
  if (len < 1 || iVar2 < iVar1) {
    return -1;
  }
  if (len < iVar2) {
    return 0;
  }
  uVar4 = 8;
  if ((7 < len) &&
     (uVar4 = (uint)len >> 1 | len, uVar4 = uVar4 >> 2 | uVar4, uVar4 = uVar4 >> 4 | uVar4,
     uVar4 = uVar4 >> 8 | uVar4, uVar4 = (uVar4 >> 0x10 | uVar4) + 1, (int)uVar4 <= len)) {
    uVar4 = len;
  }
  iVar5 = 0;
  bVar3 = false;
  if (iVar2 < (int)uVar4) {
    if ((SBORROW4(iVar2 * 7,iVar1 * 8) == iVar2 * 7 + iVar1 * -8 < 0) &&
       (__dest = (uchar *)malloc((ulong)uVar4), __dest != (uchar *)0x0)) {
      if (iVar1 != 0) {
        memcpy(__dest,__ptr,(long)iVar1);
      }
      free(__ptr);
    }
    else {
      __dest = (uchar *)realloc(__ptr,(ulong)uVar4);
      if (__dest == (uchar *)0x0) {
        iVar5 = -1;
        bVar3 = false;
        goto LAB_00119b9d;
      }
    }
    b->data = __dest;
    b->mlen = uVar4;
    iVar5 = b->slen;
    __dest[iVar5] = '\0';
    bVar3 = true;
  }
LAB_00119b9d:
  if (bVar3) {
    return 0;
  }
  return iVar5;
}

Assistant:

int balloc (bstring b, int len) {
	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen <= 0 || 
	    b->mlen < b->slen || len <= 0) {
		return BSTR_ERR;
	}

	if (len >= b->mlen) {
		unsigned char * x;

		if ((len = snapUpSize (len)) <= b->mlen) return BSTR_OK;

		/* Assume probability of a non-moving realloc is 0.125 */
		if (7 * b->mlen < 8 * b->slen) {

			/* If slen is close to mlen in size then use realloc to reduce
			   the memory defragmentation */

			x = (unsigned char *) bstr__realloc (b->data, len);
			if (x == NULL) return BSTR_ERR;
		} else {

			/* If slen is not close to mlen then avoid the penalty of copying
			   the extra bytes that are allocated, but not considered part of
			   the string */

			x = (unsigned char *) bstr__alloc (len);
			if (x == NULL) {
				x = (unsigned char *) bstr__realloc (b->data, len);
				if (x == NULL) return BSTR_ERR;
			} else {
				if (b->slen) bstr__memcpy ((char *) x, (char *) b->data, b->slen);
				bstr__free (b->data);
			}
		}
		b->data = x;
		b->mlen = len;
		b->data[b->slen] = (unsigned char) '\0';
	}

	return BSTR_OK;
}